

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

gdImagePtr gdImageRotateInterpolated(gdImagePtr src,float angle,int bgcolor)

{
  int iVar1;
  int iVar2;
  gdImagePtr pgVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  gdRect local_40;
  
  fVar13 = floorf(angle * 100.0);
  dVar14 = fmod((double)(int)fVar13,36000.0);
  if (bgcolor < 0 || src == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  iVar5 = (int)dVar14;
  if (src->trueColor == 0) {
    if ((uint)bgcolor < 0x100) {
      bgcolor = src->green[(uint)bgcolor] * 0x100 +
                src->red[(uint)bgcolor] * 0x10000 + src->alpha[(uint)bgcolor] * 0x1000000 +
                src->blue[(uint)bgcolor];
    }
    gdImagePaletteToTrueColor(src);
  }
  if (iVar5 == -27000) {
LAB_00117d90:
    pgVar3 = gdImageRotate90(src,0);
    return pgVar3;
  }
  if (iVar5 != -18000) {
    if ((iVar5 == -9000) || (iVar5 == 27000)) {
      pgVar3 = gdImageRotate270(src,0);
      return pgVar3;
    }
    if (iVar5 == 9000) goto LAB_00117d90;
    if (iVar5 != 18000) {
      if (iVar5 == 0) {
        pgVar3 = gdImageClone(src);
        if (pgVar3 == (gdImagePtr)0x0) {
          return (gdImagePtr)0x0;
        }
        if (pgVar3->trueColor == 0) {
          gdImagePaletteToTrueColor(pgVar3);
          return pgVar3;
        }
        return pgVar3;
      }
      if (src->interpolation_id + ~GD_METHOD_COUNT < 0xffffffe9) {
        return (gdImagePtr)0x0;
      }
      iVar5 = src->sx;
      iVar1 = src->sy;
      if (src->interpolation_id == GD_NEAREST_NEIGHBOUR) {
        dVar14 = (double)((angle / -180.0) * -3.1415927);
        dVar15 = cos(dVar14);
        dVar14 = sin(dVar14);
        gdRotatedImageSize(src,angle,&local_40);
        pgVar3 = gdImageCreateTrueColor(local_40.width,local_40.height);
        if (pgVar3 != (gdImagePtr)0x0) {
          pgVar3->saveAlphaFlag = 1;
          for (uVar8 = 0; uVar8 != (uint)local_40.height; uVar8 = uVar8 + 1) {
            lVar7 = (long)((local_40.height / -2 + (int)uVar8) * 0x100);
            iVar6 = local_40.width / -2 << 8;
            for (uVar11 = 0; (uint)local_40.width != uVar11; uVar11 = uVar11 + 1) {
              lVar10 = ((long)iVar6 * (long)(dVar14 * 256.0) >> 8) +
                       (lVar7 * (long)(dVar15 * 256.0) >> 8) + (long)(int)(iVar1 / 2 << 8 | 0x80) >>
                       8;
              iVar2 = bgcolor;
              if ((((0 < lVar10) && (lVar10 < (long)iVar1 + -1)) &&
                  (lVar12 = ((long)iVar6 * (long)(dVar15 * 256.0) >> 8) +
                            ((long)(int)(iVar5 / 2 << 8 | 0x80) -
                            (lVar7 * (long)(dVar14 * 256.0) >> 8)) >> 8, 0 < lVar12)) &&
                 (lVar12 < (long)iVar5 + -1)) {
                iVar2 = src->tpixels[lVar10][lVar12];
              }
              pgVar3->tpixels[uVar8][uVar11] = iVar2;
              iVar6 = iVar6 + 0x100;
            }
          }
          return pgVar3;
        }
        return (gdImagePtr)0x0;
      }
      dVar14 = (double)((angle / -180.0) * -3.1415927);
      dVar15 = cos(dVar14);
      dVar14 = sin(dVar14);
      if (bgcolor < 0) {
        return (gdImagePtr)0x0;
      }
      if (src->interpolation == (interpolation_method)0x0) {
        src->interpolation = filter_linear;
      }
      gdRotatedImageSize(src,angle,&local_40);
      pgVar3 = gdImageCreateTrueColor(local_40.width,local_40.height);
      if (pgVar3 == (gdImagePtr)0x0) {
        return (gdImagePtr)0x0;
      }
      pgVar3->saveAlphaFlag = 1;
      for (uVar8 = 0; uVar8 != (uint)local_40.height; uVar8 = uVar8 + 1) {
        lVar7 = (long)((local_40.height / -2 + (int)uVar8) * 0x100);
        iVar6 = local_40.width / -2 << 8;
        for (uVar11 = 0; (uint)local_40.width != uVar11; uVar11 = uVar11 + 1) {
          lVar10 = ((long)iVar6 * (long)(dVar14 * 256.0) >> 8) +
                   (lVar7 * (long)(dVar15 * 256.0) >> 8) + (long)(iVar1 / 2 << 8);
          lVar12 = lVar10 >> 8;
          iVar2 = bgcolor;
          if (-2 < lVar12) {
            lVar4 = (((long)iVar6 * (long)(dVar15 * 256.0) >> 8) -
                    (lVar7 * (long)(dVar14 * 256.0) >> 8)) + (long)(iVar5 / 2 << 8);
            lVar9 = lVar4 >> 8;
            if (((-2 < lVar9) && (lVar12 < iVar1)) && (lVar9 < iVar5)) {
              iVar2 = getPixelInterpolated
                                (src,(double)lVar4 * 0.00390625,(double)lVar10 * 0.00390625,bgcolor)
              ;
            }
          }
          pgVar3->tpixels[uVar8][uVar11] = iVar2;
          iVar6 = iVar6 + 0x100;
        }
      }
      return pgVar3;
    }
  }
  pgVar3 = gdImageRotate180(src,0);
  return pgVar3;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageRotateInterpolated(const gdImagePtr src, const float angle, int bgcolor)
{
	/* round to two decimals and keep the 100x multiplication to use it in the common square angles
	   case later. Keep the two decimal precisions so smaller rotation steps can be done, useful for
	   slow animations, f.e. */
	const int angle_rounded = fmod((int) floorf(angle * 100), 360 * 100);

	if (src == NULL || bgcolor < 0) {
		return NULL;
	}

	/* impact perf a bit, but not that much. Implementation for palette
	   images can be done at a later point.
	*/
	if (src->trueColor == 0) {
		if (bgcolor < gdMaxColors) {
			bgcolor =  gdTrueColorAlpha(src->red[bgcolor], src->green[bgcolor], src->blue[bgcolor], src->alpha[bgcolor]);
		}
		gdImagePaletteToTrueColor(src);
	}

	/* 0 && 90 degrees multiple rotation, 0 rotation simply clones the return image and convert it
	   to truecolor, as we must return truecolor image. */
	switch (angle_rounded) {
		case    0: {
			gdImagePtr dst = gdImageClone(src);

			if (dst == NULL) {
				return NULL;
			}
			if (dst->trueColor == 0) {
				gdImagePaletteToTrueColor(dst);
			}
			return dst;
		}

		case -27000:
		case   9000:
			return gdImageRotate90(src, 0);

		case -18000:
		case  18000:
			return gdImageRotate180(src, 0);

		case  -9000:
		case  27000:
			return gdImageRotate270(src, 0);
	}

	if (src->interpolation_id < 1 || src->interpolation_id > GD_METHOD_COUNT) {
		return NULL;
	}

	switch (src->interpolation_id) {
		case GD_NEAREST_NEIGHBOUR:
			return gdImageRotateNearestNeighbour(src, angle, bgcolor);
			break;

		case GD_BILINEAR_FIXED:
		case GD_BICUBIC_FIXED:
		default:
			return gdImageRotateGeneric(src, angle, bgcolor);
	}
	return NULL;
}